

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

void Nwk_ManSupportNodes_rec(Nwk_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = pNode->pMan->nTravIds;
  if (pNode->TravId == iVar3) {
    return;
  }
  pNode->TravId = iVar3;
  uVar1 = *(uint *)&pNode->field_0x20 & 7;
  if (uVar1 != 1) {
    if (uVar1 != 3) {
      __assert_fail("Nwk_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                    ,0x1ed,"void Nwk_ManSupportNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
    }
    if (pNode->nFanins < 1) {
      return;
    }
    lVar4 = 0;
    do {
      if (pNode->pFanio[lVar4] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManSupportNodes_rec(pNode->pFanio[lVar4],vNodes);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pNode->nFanins);
    return;
  }
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_008dce9c;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_008dce9c:
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
  vNodes->pArray[iVar3] = pNode;
  return;
}

Assistant:

void Nwk_ManSupportNodes_rec( Nwk_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Nwk_ObjIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Nwk_ObjSetTravIdCurrent( pNode );
    // collect the CI
    if ( Nwk_ObjIsCi(pNode) )
    {
        Vec_PtrPush( vNodes, pNode );
        return;
    }
    assert( Nwk_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ManSupportNodes_rec( pFanin, vNodes );
}